

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_2cc340::HandleSizeCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  cmMakefile *this;
  unsigned_long __val;
  ulong __n;
  string local_170;
  string_view local_150;
  cmAlphaNum local_140;
  cmAlphaNum local_110;
  string local_e0;
  const_reference local_c0;
  string *outputVariable;
  string *filename;
  uint argsIndex;
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = local_20;
  if (sVar3 == 3) {
    filename._0_4_ = 2;
    outputVariable =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local,1);
    __n = (ulong)(uint)filename;
    filename._0_4_ = (uint)filename + 1;
    local_c0 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,__n);
    bVar2 = cmsys::SystemTools::FileExists(outputVariable,true);
    pcVar1 = local_20;
    if (bVar2) {
      this = cmExecutionStatus::GetMakefile(local_20);
      pvVar4 = local_c0;
      __val = cmsys::SystemTools::FileLength(outputVariable);
      std::__cxx11::to_string(&local_170,__val);
      local_150 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_170);
      cmMakefile::AddDefinition(this,pvVar4,local_150);
      std::__cxx11::string::~string((string *)&local_170);
      args_local._7_1_ = true;
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_110,"SIZE requested of path that is not readable:\n  ");
      cmAlphaNum::cmAlphaNum(&local_140,outputVariable);
      cmStrCat<>(&local_e0,&local_110,&local_140);
      cmExecutionStatus::SetError(pcVar1,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      args_local._7_1_ = false;
    }
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,0);
    cmAlphaNum::cmAlphaNum(&local_70,pvVar4);
    cmAlphaNum::cmAlphaNum(&local_a0," requires a file name and output variable");
    cmStrCat<>(&local_40,&local_70,&local_a0);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    args_local._7_1_ = false;
  }
  return args_local._7_1_;
}

Assistant:

bool HandleSizeCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args[0], " requires a file name and output variable"));
    return false;
  }

  unsigned int argsIndex = 1;

  const std::string& filename = args[argsIndex++];

  const std::string& outputVariable = args[argsIndex++];

  if (!cmSystemTools::FileExists(filename, true)) {
    status.SetError(
      cmStrCat("SIZE requested of path that is not readable:\n  ", filename));
    return false;
  }

  status.GetMakefile().AddDefinition(
    outputVariable, std::to_string(cmSystemTools::FileLength(filename)));

  return true;
}